

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O0

void __thiscall
optimization::graph_color::Graph_Color::optimize_func
          (Graph_Color *this,string *funcId,MirFunction *func)

{
  bool bVar1;
  element_type *peVar2;
  ostream *poVar3;
  element_type *peVar4;
  size_type sVar5;
  ostream *poVar6;
  reference piVar7;
  ostream *poVar8;
  pointer ppVar9;
  Function *function;
  Livevar_Analyse *this_00;
  long in_RDX;
  long in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_>,_false,_true>,_bool>
  pVar10;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_false,_true>,_bool>
  pVar11;
  __enable_if_t<is_constructible<value_type,_pair<VarId,_int>_>::value,_pair<iterator,_bool>_>
  _Var12;
  iterator iter_2;
  int c;
  iterator __end2_1;
  iterator __begin2_1;
  element_type *__range2_1;
  VarId *var_1;
  iterator __end2;
  iterator __begin2;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *__range2;
  VarId var;
  iterator __end4;
  iterator __begin4;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *__range4;
  pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
  *pair;
  iterator __end3;
  iterator __begin3;
  map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  *__range3;
  iterator iter_1;
  iterator iter;
  Livevar_Analyse lva;
  mapped_type conflict_map;
  shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>
  map;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  cross_blk_vars;
  key_type *in_stack_ffffffffffffed88;
  Conflict_Map *in_stack_ffffffffffffed90;
  value_type *in_stack_ffffffffffffed98;
  string *name;
  Function *in_stack_ffffffffffffeda0;
  Function *this_01;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  *in_stack_ffffffffffffedb0;
  Conflict_Map *in_stack_ffffffffffffedb8;
  Graph_Color *in_stack_ffffffffffffedc0;
  key_type *in_stack_ffffffffffffedc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffedd0;
  Conflict_Map *in_stack_ffffffffffffee10;
  Timestamp *in_stack_ffffffffffffee18;
  Timestamp *timestamp;
  ostream *in_stack_ffffffffffffee20;
  Conflict_Map *in_stack_ffffffffffffee50;
  MirFunction *in_stack_ffffffffffffee58;
  Conflict_Map *in_stack_ffffffffffffee60;
  Severity *in_stack_ffffffffffffee88;
  allocator<char> *log_severity;
  ostream *in_stack_ffffffffffffee90;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  *in_stack_ffffffffffffef78;
  shared_ptr<optimization::graph_color::Conflict_Map> *in_stack_ffffffffffffef80;
  shared_ptr<optimization::livevar_analyse::Block_Live_Var> *in_stack_ffffffffffffef88;
  Graph_Color *in_stack_ffffffffffffef90;
  undefined1 local_f41 [40];
  undefined1 local_f19 [121];
  time_point_sys_clock local_ea0;
  Timestamp local_e98 [3];
  undefined1 local_e49;
  _Base_ptr local_e48;
  allocator<char> local_e39;
  string local_e38 [39];
  allocator<char> local_e11;
  string local_e10 [120];
  time_point_sys_clock local_d98;
  Timestamp local_d90 [3];
  undefined1 local_d41;
  _Self local_d40;
  _Self local_d38;
  undefined1 local_d29 [40];
  ostream local_d01;
  string local_d00 [120];
  time_point_sys_clock local_c88;
  Timestamp local_c80 [3];
  undefined1 local_c32;
  allocator<char> local_c31;
  string local_c30 [12];
  u_int in_stack_fffffffffffff3dc;
  MirFunction *in_stack_fffffffffffff3e0;
  shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>
  *in_stack_fffffffffffff3e8;
  Conflict_Map *in_stack_fffffffffffff3f0;
  string local_c08 [120];
  time_point_sys_clock local_b90;
  Timestamp local_b88 [3];
  undefined1 local_b3d;
  int local_b3c;
  _Self local_b38;
  _Self local_b30;
  element_type *local_b28;
  allocator<char> local_b19;
  string local_b18 [39];
  allocator<char> local_af1;
  string local_af0 [120];
  time_point_sys_clock local_a78;
  Timestamp local_a70 [3];
  undefined1 local_a22;
  allocator<char> local_a21;
  string local_a20 [39];
  allocator<char> local_9f9;
  string local_9f8 [120];
  time_point_sys_clock local_980;
  Timestamp local_978 [3];
  undefined1 local_929;
  _Base_ptr local_928;
  undefined1 local_920;
  undefined4 local_914;
  reference local_8f8;
  _Self local_8f0;
  _Self local_8e8;
  undefined1 *local_8e0;
  allocator<char> local_8d1;
  string local_8d0 [39];
  allocator<char> local_8a9;
  string local_8a8 [120];
  time_point_sys_clock local_830;
  Timestamp local_828 [3];
  undefined1 local_7da;
  allocator<char> local_7d9;
  string local_7d8 [39];
  allocator<char> local_7b1;
  string local_7b0 [120];
  time_point_sys_clock local_738;
  Timestamp local_730 [3];
  undefined1 local_6e1;
  _Self local_6d0;
  _Self local_6c8;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *local_6c0;
  allocator<char> local_6b1;
  string local_6b0 [39];
  allocator<char> local_689;
  string local_688 [120];
  time_point_sys_clock local_610;
  Timestamp local_608 [3];
  undefined1 local_5b9;
  reference local_5b8;
  _Self local_5b0;
  _Self local_5a8;
  map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  *local_5a0;
  _Self local_588;
  _Self local_580;
  allocator<char> local_571;
  string local_570 [39];
  allocator<char> local_549;
  string local_548 [120];
  time_point_sys_clock local_4d0;
  Timestamp local_4c8 [3];
  undefined1 local_479;
  _Self local_468;
  _Self local_460 [15];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_true>
  local_3e8;
  undefined1 local_3e0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_>,_true>
  local_1d8;
  undefined1 local_1d0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined1 local_158 [55];
  allocator<char> local_121;
  string local_120 [39];
  allocator<char> local_f9;
  string local_f8 [120];
  time_point_sys_clock local_80;
  Timestamp local_78 [3];
  undefined1 local_19;
  long local_18;
  
  local_18 = in_RDX;
  peVar2 = std::
           __shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1a5478);
  if ((peVar2->is_extern & 1U) == 0) {
    local_19 = 0;
    AixLog::operator<<(in_stack_ffffffffffffee90,in_stack_ffffffffffffee88);
    AixLog::Tag::Tag((Tag *)0x1a54bc);
    AixLog::operator<<((ostream *)in_stack_ffffffffffffedc0,(Tag *)in_stack_ffffffffffffedb8);
    local_80.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(local_78,&local_80);
    AixLog::operator<<(in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffedd0,(char *)in_stack_ffffffffffffedc8,
               (allocator<char> *)in_stack_ffffffffffffedc0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffedd0,(char *)in_stack_ffffffffffffedc8,
               (allocator<char> *)in_stack_ffffffffffffedc0);
    AixLog::Function::Function
              (in_stack_ffffffffffffeda0,&in_stack_ffffffffffffed98->first,
               (string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88);
    poVar3 = AixLog::operator<<((ostream *)in_stack_ffffffffffffedc0,
                                (Function *)in_stack_ffffffffffffedb8);
    poVar3 = std::operator<<(poVar3,"Running graph coloring for");
    poVar3 = std::operator<<(poVar3,(string *)(local_18 + 8));
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    AixLog::Function::~Function((Function *)in_stack_ffffffffffffed90);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator(&local_121);
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator(&local_f9);
    AixLog::Timestamp::~Timestamp(local_78);
    AixLog::Tag::~Tag((Tag *)0x1a5679);
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::set
              ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)0x1a5686);
    local_178 = 0;
    uStack_170 = 0;
    local_188 = 0;
    uStack_180 = 0;
    local_198 = 0;
    uStack_190 = 0;
    std::
    map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
    ::map((map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
           *)0x1a56b6);
    std::
    make_shared<std::map<mir::inst::VarId,int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,int>>>,std::map<mir::inst::VarId,int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,int>>>>
              ((map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
                *)in_stack_ffffffffffffedb8);
    std::
    map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
    ::~map((map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
            *)0x1a56da);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_&,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_>
                *)in_stack_ffffffffffffeda0,&in_stack_ffffffffffffed98->first,
               (shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>
                *)in_stack_ffffffffffffed90);
    pVar10 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_>_>_>
             ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_>_>_>
                       *)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
    local_1d8._M_cur =
         (__node_type *)
         pVar10.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_>,_true>
         ._M_cur;
    local_1d0 = pVar10.second;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_>
             *)in_stack_ffffffffffffed90);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_>_>_>
    ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffed90,in_stack_ffffffffffffed88);
    std::
    shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>
    ::shared_ptr((shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>
                  *)in_stack_ffffffffffffed90,
                 (shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>
                  *)in_stack_ffffffffffffed88);
    Conflict_Map::Conflict_Map
              (in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8,in_stack_fffffffffffff3e0,
               in_stack_fffffffffffff3dc);
    std::
    make_shared<optimization::graph_color::Conflict_Map,optimization::graph_color::Conflict_Map>
              (in_stack_ffffffffffffedb8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::graph_color::Conflict_Map>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::graph_color::Conflict_Map>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::graph_color::Conflict_Map>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::graph_color::Conflict_Map>_>_>_>
                  *)in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8);
    std::shared_ptr<optimization::graph_color::Conflict_Map>::operator=
              ((shared_ptr<optimization::graph_color::Conflict_Map> *)in_stack_ffffffffffffed90,
               (shared_ptr<optimization::graph_color::Conflict_Map> *)in_stack_ffffffffffffed88);
    std::shared_ptr<optimization::graph_color::Conflict_Map>::~shared_ptr
              ((shared_ptr<optimization::graph_color::Conflict_Map> *)0x1a582f);
    Conflict_Map::~Conflict_Map(in_stack_ffffffffffffed90);
    std::
    shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>
    ::~shared_ptr((shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>
                   *)0x1a5849);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::graph_color::Conflict_Map>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::graph_color::Conflict_Map>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::graph_color::Conflict_Map>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::graph_color::Conflict_Map>_>_>_>
                  *)in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8);
    std::shared_ptr<optimization::graph_color::Conflict_Map>::shared_ptr
              ((shared_ptr<optimization::graph_color::Conflict_Map> *)in_stack_ffffffffffffed90,
               (shared_ptr<optimization::graph_color::Conflict_Map> *)in_stack_ffffffffffffed88);
    std::
    __shared_ptr_access<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1a58af);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_>_&,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                *)in_stack_ffffffffffffeda0,&in_stack_ffffffffffffed98->first,
               (shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_> *)
               in_stack_ffffffffffffed90);
    pVar11 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
             ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                       *)in_stack_ffffffffffffeda0,(value_type *)in_stack_ffffffffffffed98);
    local_3e8._M_cur =
         (__node_type *)
         pVar11.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_true>
         ._M_cur;
    local_3e0 = pVar11.second;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
             *)in_stack_ffffffffffffed90);
    livevar_analyse::Livevar_Analyse::Livevar_Analyse
              ((Livevar_Analyse *)in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
               SUB81((ulong)in_stack_ffffffffffffee50 >> 0x38,0));
    livevar_analyse::Livevar_Analyse::build((Livevar_Analyse *)in_stack_ffffffffffffedc0);
    local_460[0]._M_node =
         (_Base_ptr)
         std::
         map<int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>_>_>_>
         ::begin((map<int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>_>_>_>
                  *)in_stack_ffffffffffffed88);
    while( true ) {
      local_468._M_node =
           (_Base_ptr)
           std::
           map<int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>_>_>_>
           ::end((map<int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>_>_>_>
                  *)in_stack_ffffffffffffed88);
      bVar1 = std::operator!=(local_460,&local_468);
      if (!bVar1) break;
      std::
      _Rb_tree_iterator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>_>_>
                    *)0x1a59a1);
      std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>::shared_ptr
                ((shared_ptr<optimization::livevar_analyse::Block_Live_Var> *)
                 in_stack_ffffffffffffed90,
                 (shared_ptr<optimization::livevar_analyse::Block_Live_Var> *)
                 in_stack_ffffffffffffed88);
      init_cross_blk_vars(in_stack_ffffffffffffedc0,(sharedPtrBlkLivevar *)in_stack_ffffffffffffedb8
                          ,in_stack_ffffffffffffedb0);
      std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>::~shared_ptr
                ((shared_ptr<optimization::livevar_analyse::Block_Live_Var> *)0x1a59e9);
      std::
      _Rb_tree_iterator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>_>_>
                    *)in_stack_ffffffffffffed90);
    }
    local_479 = 0;
    AixLog::operator<<(in_stack_ffffffffffffee90,in_stack_ffffffffffffee88);
    AixLog::Tag::Tag((Tag *)0x1a5c65);
    AixLog::operator<<((ostream *)in_stack_ffffffffffffedc0,(Tag *)in_stack_ffffffffffffedb8);
    local_4d0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(local_4c8,&local_4d0);
    AixLog::operator<<(in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffedd0,(char *)in_stack_ffffffffffffedc8,
               (allocator<char> *)in_stack_ffffffffffffedc0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffedd0,(char *)in_stack_ffffffffffffedc8,
               (allocator<char> *)in_stack_ffffffffffffedc0);
    AixLog::Function::Function
              (in_stack_ffffffffffffeda0,&in_stack_ffffffffffffed98->first,
               (string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88);
    poVar3 = AixLog::operator<<((ostream *)in_stack_ffffffffffffedc0,
                                (Function *)in_stack_ffffffffffffedb8);
    poVar3 = std::operator<<(poVar3," Conflict map :");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    AixLog::Function::~Function((Function *)in_stack_ffffffffffffed90);
    std::__cxx11::string::~string(local_570);
    std::allocator<char>::~allocator(&local_571);
    std::__cxx11::string::~string(local_548);
    std::allocator<char>::~allocator(&local_549);
    AixLog::Timestamp::~Timestamp(local_4c8);
    AixLog::Tag::~Tag((Tag *)0x1a5e01);
    if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
      local_580._M_node =
           (_Base_ptr)
           std::
           map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
           ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                    *)in_stack_ffffffffffffed88);
      while( true ) {
        local_588._M_node =
             (_Base_ptr)
             std::
             map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
             ::end((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                    *)in_stack_ffffffffffffed88);
        bVar1 = std::operator!=(&local_580,&local_588);
        if (!bVar1) break;
        std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x1a5e70);
        std::
        map<int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>_>_>_>
        ::operator[]((map<int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>_>_>_>
                      *)in_stack_ffffffffffffedd0,(key_type *)in_stack_ffffffffffffedc8);
        std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>::shared_ptr
                  ((shared_ptr<optimization::livevar_analyse::Block_Live_Var> *)
                   in_stack_ffffffffffffed90,
                   (shared_ptr<optimization::livevar_analyse::Block_Live_Var> *)
                   in_stack_ffffffffffffed88);
        init_conflict_map(in_stack_ffffffffffffef90,in_stack_ffffffffffffef88,
                          in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
        std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>::~shared_ptr
                  ((shared_ptr<optimization::livevar_analyse::Block_Live_Var> *)0x1a5edb);
        std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator++
                  ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                   in_stack_ffffffffffffed90);
      }
      std::
      __shared_ptr_access<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1a6008);
      Conflict_Map::init_edge_vars(in_stack_ffffffffffffee10);
      peVar4 = std::
               __shared_ptr_access<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1a601f);
      local_5a0 = &peVar4->dynamic_Map;
      local_5a8._M_node =
           (_Base_ptr)
           std::
           map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
           ::begin((map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                    *)in_stack_ffffffffffffed88);
      local_5b0._M_node =
           (_Base_ptr)
           std::
           map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
           ::end((map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                  *)in_stack_ffffffffffffed88);
      while (bVar1 = std::operator!=(&local_5a8,&local_5b0), bVar1) {
        local_5b8 = std::
                    _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>
                    ::operator*((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>
                                 *)0x1a6080);
        local_5b9 = 0;
        AixLog::operator<<(in_stack_ffffffffffffee90,in_stack_ffffffffffffee88);
        AixLog::Tag::Tag((Tag *)0x1a60bb);
        AixLog::operator<<((ostream *)in_stack_ffffffffffffedc0,(Tag *)in_stack_ffffffffffffedb8);
        local_610.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        AixLog::Timestamp::Timestamp(local_608,&local_610);
        AixLog::operator<<(in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffedd0,(char *)in_stack_ffffffffffffedc8,
                   (allocator<char> *)in_stack_ffffffffffffedc0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffedd0,(char *)in_stack_ffffffffffffedc8,
                   (allocator<char> *)in_stack_ffffffffffffedc0);
        AixLog::Function::Function
                  (in_stack_ffffffffffffeda0,&in_stack_ffffffffffffed98->first,
                   (string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88);
        AixLog::operator<<((ostream *)in_stack_ffffffffffffedc0,
                           (Function *)in_stack_ffffffffffffedb8);
        poVar3 = prelude::operator<<((ostream *)in_stack_ffffffffffffed90,
                                     (Displayable *)in_stack_ffffffffffffed88);
        std::operator<<(poVar3," conflicts with : ");
        AixLog::Function::~Function((Function *)in_stack_ffffffffffffed90);
        std::__cxx11::string::~string(local_6b0);
        std::allocator<char>::~allocator(&local_6b1);
        std::__cxx11::string::~string(local_688);
        std::allocator<char>::~allocator(&local_689);
        AixLog::Timestamp::~Timestamp(local_608);
        AixLog::Tag::~Tag((Tag *)0x1a6258);
        local_6c0 = &local_5b8->second;
        local_6c8._M_node =
             (_Base_ptr)
             std::
             set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
             begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                    *)in_stack_ffffffffffffed88);
        local_6d0._M_node =
             (_Base_ptr)
             std::
             set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
             end((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  *)in_stack_ffffffffffffed88);
        while (bVar1 = std::operator!=(&local_6c8,&local_6d0), bVar1) {
          std::_Rb_tree_const_iterator<mir::inst::VarId>::operator*
                    ((_Rb_tree_const_iterator<mir::inst::VarId> *)0x1a62c1);
          mir::inst::VarId::VarId
                    ((VarId *)in_stack_ffffffffffffed90,(VarId *)in_stack_ffffffffffffed88);
          local_6e1 = 0;
          AixLog::operator<<(in_stack_ffffffffffffee90,in_stack_ffffffffffffee88);
          AixLog::Tag::Tag((Tag *)0x1a6304);
          AixLog::operator<<((ostream *)in_stack_ffffffffffffedc0,(Tag *)in_stack_ffffffffffffedb8);
          local_738.__d.__r = (duration)std::chrono::_V2::system_clock::now();
          AixLog::Timestamp::Timestamp(local_730,&local_738);
          AixLog::operator<<(in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffedd0,(char *)in_stack_ffffffffffffedc8,
                     (allocator<char> *)in_stack_ffffffffffffedc0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffedd0,(char *)in_stack_ffffffffffffedc8,
                     (allocator<char> *)in_stack_ffffffffffffedc0);
          AixLog::Function::Function
                    (in_stack_ffffffffffffeda0,&in_stack_ffffffffffffed98->first,
                     (string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88);
          AixLog::operator<<((ostream *)in_stack_ffffffffffffedc0,
                             (Function *)in_stack_ffffffffffffedb8);
          poVar3 = prelude::operator<<((ostream *)in_stack_ffffffffffffed90,
                                       (Displayable *)in_stack_ffffffffffffed88);
          std::operator<<(poVar3,", ");
          AixLog::Function::~Function((Function *)in_stack_ffffffffffffed90);
          std::__cxx11::string::~string(local_7d8);
          std::allocator<char>::~allocator(&local_7d9);
          std::__cxx11::string::~string(local_7b0);
          std::allocator<char>::~allocator(&local_7b1);
          AixLog::Timestamp::~Timestamp(local_730);
          AixLog::Tag::~Tag((Tag *)0x1a64a1);
          std::_Rb_tree_const_iterator<mir::inst::VarId>::operator++
                    ((_Rb_tree_const_iterator<mir::inst::VarId> *)in_stack_ffffffffffffed90);
        }
        local_7da = 0;
        AixLog::operator<<(in_stack_ffffffffffffee90,in_stack_ffffffffffffee88);
        AixLog::Tag::Tag((Tag *)0x1a66b6);
        AixLog::operator<<((ostream *)in_stack_ffffffffffffedc0,(Tag *)in_stack_ffffffffffffedb8);
        local_830.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        AixLog::Timestamp::Timestamp(local_828,&local_830);
        AixLog::operator<<(in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffedd0,(char *)in_stack_ffffffffffffedc8,
                   (allocator<char> *)in_stack_ffffffffffffedc0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffedd0,(char *)in_stack_ffffffffffffedc8,
                   (allocator<char> *)in_stack_ffffffffffffedc0);
        AixLog::Function::Function
                  (in_stack_ffffffffffffeda0,&in_stack_ffffffffffffed98->first,
                   (string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88);
        poVar3 = AixLog::operator<<((ostream *)in_stack_ffffffffffffedc0,
                                    (Function *)in_stack_ffffffffffffedb8);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        AixLog::Function::~Function((Function *)in_stack_ffffffffffffed90);
        std::__cxx11::string::~string(local_8d0);
        std::allocator<char>::~allocator(&local_8d1);
        std::__cxx11::string::~string(local_8a8);
        std::allocator<char>::~allocator(&local_8a9);
        AixLog::Timestamp::~Timestamp(local_828);
        AixLog::Tag::~Tag((Tag *)0x1a6834);
        std::
        _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>
                      *)in_stack_ffffffffffffed90);
      }
      while( true ) {
        std::
        __shared_ptr_access<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1a693d);
        bVar1 = std::
                map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                ::empty((map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                         *)0x1a6949);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        std::
        __shared_ptr_access<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1a695e);
        Conflict_Map::remove_edge_less_colors(in_stack_ffffffffffffee60);
        std::
        __shared_ptr_access<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1a6975);
        Conflict_Map::remove_edge_larger_colors(in_stack_ffffffffffffee10);
      }
      std::
      __shared_ptr_access<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1a698e);
      Conflict_Map::rebuild(in_stack_ffffffffffffee50);
    }
    local_8e0 = local_158;
    local_8e8._M_node =
         (_Base_ptr)
         std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
         ::begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  *)in_stack_ffffffffffffed88);
    local_8f0._M_node =
         (_Base_ptr)
         std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
         ::end((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)in_stack_ffffffffffffed88);
    while (bVar1 = std::operator!=(&local_8e8,&local_8f0), bVar1) {
      local_8f8 = std::_Rb_tree_const_iterator<mir::inst::VarId>::operator*
                            ((_Rb_tree_const_iterator<mir::inst::VarId> *)0x1a69ff);
      std::
      __shared_ptr_access<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1a6a14);
      std::
      __shared_ptr_access<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1a6a23);
      sVar5 = std::
              map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
              ::count((map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
                       *)in_stack_ffffffffffffeda0,(key_type *)in_stack_ffffffffffffed98);
      if (sVar5 == 0) {
        std::
        __shared_ptr_access<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1a6a5c);
        std::
        __shared_ptr_access<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1a6a6b);
        local_914 = 0xffffffff;
        std::make_pair<mir::inst::VarId_const&,int>
                  ((VarId *)in_stack_ffffffffffffed98,(int *)in_stack_ffffffffffffed90);
        _Var12 = std::
                 map<mir::inst::VarId,int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,int>>>
                 ::insert<std::pair<mir::inst::VarId,int>>
                           ((map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
                             *)in_stack_ffffffffffffeda0,
                            (pair<mir::inst::VarId,_int> *)in_stack_ffffffffffffed98);
        local_928 = (_Base_ptr)_Var12.first._M_node;
        local_920 = _Var12.second;
      }
      std::_Rb_tree_const_iterator<mir::inst::VarId>::operator++
                ((_Rb_tree_const_iterator<mir::inst::VarId> *)in_stack_ffffffffffffed90);
    }
    local_929 = 0;
    AixLog::operator<<(in_stack_ffffffffffffee90,in_stack_ffffffffffffee88);
    AixLog::Tag::Tag((Tag *)0x1a6b28);
    AixLog::operator<<((ostream *)in_stack_ffffffffffffedc0,(Tag *)in_stack_ffffffffffffedb8);
    local_980.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(local_978,&local_980);
    AixLog::operator<<(in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffedd0,(char *)in_stack_ffffffffffffedc8,
               (allocator<char> *)in_stack_ffffffffffffedc0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffedd0,(char *)in_stack_ffffffffffffedc8,
               (allocator<char> *)in_stack_ffffffffffffedc0);
    AixLog::Function::Function
              (in_stack_ffffffffffffeda0,&in_stack_ffffffffffffed98->first,
               (string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88);
    poVar3 = AixLog::operator<<((ostream *)in_stack_ffffffffffffedc0,
                                (Function *)in_stack_ffffffffffffedb8);
    poVar3 = std::operator<<(poVar3,(string *)(local_18 + 8));
    poVar3 = std::operator<<(poVar3," coloring result : ");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    AixLog::Function::~Function((Function *)in_stack_ffffffffffffed90);
    std::__cxx11::string::~string(local_a20);
    std::allocator<char>::~allocator(&local_a21);
    std::__cxx11::string::~string(local_9f8);
    std::allocator<char>::~allocator(&local_9f9);
    AixLog::Timestamp::~Timestamp(local_978);
    AixLog::Tag::~Tag((Tag *)0x1a6ce7);
    local_a22 = 0;
    AixLog::operator<<(in_stack_ffffffffffffee90,in_stack_ffffffffffffee88);
    AixLog::Tag::Tag((Tag *)0x1a6d1a);
    AixLog::operator<<((ostream *)in_stack_ffffffffffffedc0,(Tag *)in_stack_ffffffffffffedb8);
    local_a78.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(local_a70,&local_a78);
    poVar3 = AixLog::operator<<(in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
    log_severity = &local_af1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffedd0,(char *)in_stack_ffffffffffffedc8,
               (allocator<char> *)in_stack_ffffffffffffedc0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffedd0,(char *)in_stack_ffffffffffffedc8,
               (allocator<char> *)in_stack_ffffffffffffedc0);
    AixLog::Function::Function
              (in_stack_ffffffffffffeda0,&in_stack_ffffffffffffed98->first,
               (string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88);
    poVar6 = AixLog::operator<<((ostream *)in_stack_ffffffffffffedc0,
                                (Function *)in_stack_ffffffffffffedb8);
    std::operator<<(poVar6,"unused colors : ");
    AixLog::Function::~Function((Function *)in_stack_ffffffffffffed90);
    std::__cxx11::string::~string(local_b18);
    std::allocator<char>::~allocator(&local_b19);
    std::__cxx11::string::~string(local_af0);
    std::allocator<char>::~allocator(&local_af1);
    AixLog::Timestamp::~Timestamp(local_a70);
    AixLog::Tag::~Tag((Tag *)0x1a6e98);
    std::
    __shared_ptr_access<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1a6ea5);
    local_b28 = std::
                __shared_ptr_access<std::set<int,_std::less<int>,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<std::set<int,_std::less<int>,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)in_stack_ffffffffffffed90);
    local_b30._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffed88);
    local_b38._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffed88);
    while (bVar1 = std::operator!=(&local_b30,&local_b38), bVar1) {
      piVar7 = std::_Rb_tree_const_iterator<int>::operator*
                         ((_Rb_tree_const_iterator<int> *)in_stack_ffffffffffffed90);
      local_b3c = *piVar7;
      local_b3d = 0;
      AixLog::operator<<(poVar3,(Severity *)log_severity);
      AixLog::Tag::Tag((Tag *)0x1a6f4d);
      AixLog::operator<<((ostream *)in_stack_ffffffffffffedc0,(Tag *)in_stack_ffffffffffffedb8);
      local_b90.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      AixLog::Timestamp::Timestamp(local_b88,&local_b90);
      AixLog::operator<<(in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffedd0,(char *)in_stack_ffffffffffffedc8,
                 (allocator<char> *)in_stack_ffffffffffffedc0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffedd0,(char *)in_stack_ffffffffffffedc8,
                 (allocator<char> *)in_stack_ffffffffffffedc0);
      AixLog::Function::Function
                (in_stack_ffffffffffffeda0,&in_stack_ffffffffffffed98->first,
                 (string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88);
      poVar6 = AixLog::operator<<((ostream *)in_stack_ffffffffffffedc0,
                                  (Function *)in_stack_ffffffffffffedb8);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_b3c);
      std::operator<<(poVar6," ");
      AixLog::Function::~Function((Function *)in_stack_ffffffffffffed90);
      std::__cxx11::string::~string(local_c30);
      std::allocator<char>::~allocator(&local_c31);
      std::__cxx11::string::~string(local_c08);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff3f7);
      AixLog::Timestamp::~Timestamp(local_b88);
      AixLog::Tag::~Tag((Tag *)0x1a70e9);
      std::_Rb_tree_const_iterator<int>::operator++
                ((_Rb_tree_const_iterator<int> *)in_stack_ffffffffffffed90);
    }
    local_c32 = 0;
    AixLog::operator<<(poVar3,(Severity *)log_severity);
    AixLog::Tag::Tag((Tag *)0x1a73e6);
    AixLog::operator<<((ostream *)in_stack_ffffffffffffedc0,(Tag *)in_stack_ffffffffffffedb8);
    local_c88.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(local_c80,&local_c88);
    AixLog::operator<<(in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
    poVar6 = &local_d01;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffedd0,(char *)in_stack_ffffffffffffedc8,
               (allocator<char> *)in_stack_ffffffffffffedc0);
    timestamp = (Timestamp *)local_d29;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffedd0,(char *)in_stack_ffffffffffffedc8,
               (allocator<char> *)in_stack_ffffffffffffedc0);
    AixLog::Function::Function
              (in_stack_ffffffffffffeda0,&in_stack_ffffffffffffed98->first,
               (string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88);
    poVar8 = AixLog::operator<<((ostream *)in_stack_ffffffffffffedc0,
                                (Function *)in_stack_ffffffffffffedb8);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    AixLog::Function::~Function((Function *)in_stack_ffffffffffffed90);
    std::__cxx11::string::~string((string *)(local_d29 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_d29);
    std::__cxx11::string::~string(local_d00);
    std::allocator<char>::~allocator((allocator<char> *)&local_d01);
    AixLog::Timestamp::~Timestamp(local_c80);
    AixLog::Tag::~Tag((Tag *)0x1a7564);
    std::
    __shared_ptr_access<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1a7571);
    std::
    __shared_ptr_access<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1a7580);
    local_d38._M_node =
         (_Base_ptr)
         std::
         map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
         ::begin((map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
                  *)in_stack_ffffffffffffed88);
    while( true ) {
      std::
      __shared_ptr_access<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<optimization::graph_color::Conflict_Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1a759d);
      std::
      __shared_ptr_access<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1a75ac);
      local_d40._M_node =
           (_Base_ptr)
           std::
           map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
           ::end((map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
                  *)in_stack_ffffffffffffed88);
      bVar1 = std::operator!=(&local_d38,&local_d40);
      if (!bVar1) break;
      local_d41 = 0;
      AixLog::operator<<(poVar3,(Severity *)log_severity);
      AixLog::Tag::Tag((Tag *)0x1a760d);
      AixLog::operator<<((ostream *)in_stack_ffffffffffffedc0,(Tag *)in_stack_ffffffffffffedb8);
      local_d98.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      AixLog::Timestamp::Timestamp(local_d90,&local_d98);
      AixLog::operator<<(poVar6,timestamp);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffedd0,(char *)in_stack_ffffffffffffedc8,
                 (allocator<char> *)in_stack_ffffffffffffedc0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffedd0,(char *)in_stack_ffffffffffffedc8,
                 (allocator<char> *)in_stack_ffffffffffffedc0);
      AixLog::Function::Function
                (in_stack_ffffffffffffeda0,&in_stack_ffffffffffffed98->first,
                 (string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88);
      poVar8 = AixLog::operator<<((ostream *)in_stack_ffffffffffffedc0,
                                  (Function *)in_stack_ffffffffffffedb8);
      std::operator<<(poVar8,"variable ");
      std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_int>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_int>_> *)0x1a7724);
      in_stack_ffffffffffffedd0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           prelude::operator<<((ostream *)in_stack_ffffffffffffed90,
                               (Displayable *)in_stack_ffffffffffffed88);
      in_stack_ffffffffffffedc8 =
           (key_type *)std::operator<<((ostream *)in_stack_ffffffffffffedd0," color: ");
      ppVar9 = std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_int>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_int>_> *)0x1a775d);
      in_stack_ffffffffffffedc0 =
           (Graph_Color *)std::ostream::operator<<(in_stack_ffffffffffffedc8,ppVar9->second);
      std::ostream::operator<<(in_stack_ffffffffffffedc0,std::endl<char,std::char_traits<char>>);
      AixLog::Function::~Function((Function *)in_stack_ffffffffffffed90);
      std::__cxx11::string::~string(local_e38);
      std::allocator<char>::~allocator(&local_e39);
      std::__cxx11::string::~string(local_e10);
      std::allocator<char>::~allocator(&local_e11);
      AixLog::Timestamp::~Timestamp(local_d90);
      AixLog::Tag::~Tag((Tag *)0x1a77df);
      local_e48 = (_Base_ptr)
                  std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_int>_>::operator++
                            ((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_int>_> *)
                             in_stack_ffffffffffffed98,
                             (int)((ulong)in_stack_ffffffffffffed90 >> 0x20));
    }
    local_e49 = 0;
    function = (Function *)AixLog::operator<<(poVar3,(Severity *)log_severity);
    AixLog::Tag::Tag((Tag *)0x1a79fb);
    AixLog::operator<<((ostream *)in_stack_ffffffffffffedc0,(Tag *)function);
    local_ea0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(local_e98,&local_ea0);
    AixLog::operator<<(poVar6,timestamp);
    this_01 = (Function *)local_f19;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffedd0,(char *)in_stack_ffffffffffffedc8,
               (allocator<char> *)in_stack_ffffffffffffedc0);
    name = (string *)local_f41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffedd0,(char *)in_stack_ffffffffffffedc8,
               (allocator<char> *)in_stack_ffffffffffffedc0);
    AixLog::Function::Function
              (this_01,name,(string *)in_stack_ffffffffffffed90,(size_t)in_stack_ffffffffffffed88);
    this_00 = (Livevar_Analyse *)AixLog::operator<<((ostream *)in_stack_ffffffffffffedc0,function);
    poVar3 = std::operator<<((ostream *)this_00,"****************************************");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    AixLog::Function::~Function((Function *)this_00);
    std::__cxx11::string::~string((string *)(local_f41 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_f41);
    std::__cxx11::string::~string((string *)(local_f19 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_f19);
    AixLog::Timestamp::~Timestamp(local_e98);
    AixLog::Tag::~Tag((Tag *)0x1a7b6e);
    livevar_analyse::Livevar_Analyse::~Livevar_Analyse(this_00);
    std::shared_ptr<optimization::graph_color::Conflict_Map>::~shared_ptr
              ((shared_ptr<optimization::graph_color::Conflict_Map> *)0x1a7b88);
    std::
    shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>
    ::~shared_ptr((shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>
                   *)0x1a7b95);
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::~set
              ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)0x1a7ba2);
  }
  return;
}

Assistant:

void optimize_func(std::string funcId, mir::inst::MirFunction& func) {
    if (func.type->is_extern) {
      return;
    }
    LOG(TRACE) << "Running graph coloring for" << func.name << std::endl;
    std::set<mir::inst::VarId> cross_blk_vars;
    auto map = std::make_shared<Color_Map>(std::map<mir::inst::VarId, color>());
    func_color_map.insert({funcId, map});
    func_conflict_map[funcId] = std::make_shared<Conflict_Map>(
        Conflict_Map(func_color_map[funcId], func, color_num));
    auto conflict_map = func_conflict_map[funcId];
    func_unused_colors.insert({funcId, conflict_map->unused_colors});
    livevar_analyse::Livevar_Analyse lva(func, true);
    lva.build();
    for (auto iter = lva.livevars.begin(); iter != lva.livevars.end(); ++iter) {
      init_cross_blk_vars(iter->second, cross_blk_vars);
    }
    LOG(TRACE) << " Conflict map :" << std::endl;

    if (enable) {
      for (auto iter = func.basic_blks.begin(); iter != func.basic_blks.end();
           ++iter) {
        init_conflict_map(lva.livevars[iter->first], conflict_map,
                          cross_blk_vars);
      }
      conflict_map->init_edge_vars();
      for (auto& pair : conflict_map->dynamic_Map) {
        LOG(TRACE) << pair.first << " conflicts with : ";
        for (auto var : pair.second) {
          LOG(TRACE) << var << ", ";
        }
        LOG(TRACE) << std::endl;
      }
      while (!conflict_map->dynamic_Map.empty()) {
        conflict_map->remove_edge_less_colors();
        conflict_map->remove_edge_larger_colors();
      }
      conflict_map->rebuild();
    }

    for (auto& var : cross_blk_vars) {
      if (!conflict_map->color_map->count(var)) {
        conflict_map->color_map->insert(std::make_pair(var, -1));
      }
    }
    LOG(TRACE) << func.name << " coloring result : " << std::endl;
    LOG(TRACE) << "unused colors : ";
    for (auto c : *conflict_map->unused_colors) {
      LOG(TRACE) << c << " ";
    }
    LOG(TRACE) << std::endl;
    for (auto iter = conflict_map->color_map->begin();
         iter != conflict_map->color_map->end(); iter++) {
      LOG(TRACE) << "variable " << iter->first << " color: " << iter->second
                 << std::endl;
    }
    LOG(TRACE) << "****************************************" << std::endl;
  }